

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string * get_system_error_abi_cxx11_(int error_code)

{
  char *pcVar1;
  int in_ESI;
  string *in_RDI;
  allocator local_d [13];
  
  pcVar1 = strerror(in_ESI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,local_d);
  std::allocator<char>::~allocator((allocator<char> *)local_d);
  return in_RDI;
}

Assistant:

std::string get_system_error(int error_code) {
#if defined(__MINGW32__) || !defined(_WIN32)
  return strerror(error_code);
#else
  enum { BUFFER_SIZE = 200 };
  char buffer[BUFFER_SIZE];
  if (strerror_s(buffer, BUFFER_SIZE, error_code))
    throw std::exception("strerror_s failed");
  return buffer;
#endif
}